

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.h
# Opt level: O1

void __thiscall mario::EventLoop::assertInLoopThread(EventLoop *this)

{
  int iVar1;
  long in_FS_OFFSET;
  
  iVar1 = this->_threadId;
  if (*(int *)(in_FS_OFFSET + -8) == 0) {
    CurrentThread::cacheTid();
  }
  if (iVar1 == *(int *)(in_FS_OFFSET + -8)) {
    return;
  }
  abortNotInLoopThread(this);
  return;
}

Assistant:

void assertInLoopThread() {
		if (!isInLoopThread()) {
			abortNotInLoopThread();
		}
	}